

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tilemap.cpp
# Opt level: O0

void __thiscall imgtogb::Tilemap::Tilemap(Tilemap *this,Image *img,int offset)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  reference piVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>,_std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>_>
  pVar6;
  pair<int,_imgtogb::Tile> local_98;
  _Self local_78;
  iterator it;
  _Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_> _Stack_68;
  bool found;
  mmap_range range;
  int hash;
  undefined1 local_48 [8];
  Tile tile;
  size_t ix;
  size_t iy;
  int offset_local;
  Image *img_local;
  Tilemap *this_local;
  
  this->img = img;
  this->offset = offset;
  iVar3 = cimg_library::CImg<unsigned_char>::width(img);
  this->tiles_x = (long)(iVar3 / 8);
  iVar3 = cimg_library::CImg<unsigned_char>::height(img);
  this->tiles_y = (long)(iVar3 / 8);
  this->ntiles = 0;
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::matrix(&this->tilemap,this->tiles_x,this->tiles_y);
  std::
  multimap<int,_imgtogb::Tile,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
  ::multimap(&this->map);
  ix = 0;
  do {
    if (this->tiles_y <= ix) {
      return;
    }
    tile.id = 0;
    tile._20_4_ = 0;
    for (; (ulong)tile._16_8_ < this->tiles_x; tile._16_8_ = tile._16_8_ + 1) {
      Tile::Tile((Tile *)local_48,tile._16_8_,ix,(int)this->ntiles);
      range.second._M_node._0_4_ = anon_unknown.dwarf_768d4::tile_hash((Tile *)local_48,img);
      pVar6 = std::
              multimap<int,_imgtogb::Tile,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
              ::equal_range(&this->map,(key_type *)&range.second);
      range.first = pVar6.second._M_node;
      _Stack_68 = pVar6.first._M_node;
      it._M_node._7_1_ = std::operator!=(&stack0xffffffffffffff98,&range.first);
      if ((bool)it._M_node._7_1_) {
        it._M_node._7_1_ = 0;
        local_78._M_node = _Stack_68._M_node;
        while (bVar2 = std::operator!=(&local_78,&range.first), bVar2) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>::operator->
                             (&local_78);
          bVar2 = compare((Tile *)local_48,&ppVar4->second,img);
          if (bVar2) {
            it._M_node._7_1_ = 1;
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>::operator->
                               (&local_78);
            iVar3 = (ppVar4->second).id;
            piVar5 = boost::numeric::ublas::
                     matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                     ::operator()(&this->tilemap,tile._16_8_,ix);
            *piVar5 = iVar3;
            break;
          }
          std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>::operator++(&local_78);
        }
      }
      if ((it._M_node._7_1_ & 1) == 0) {
        std::pair<int,_imgtogb::Tile>::pair<int_&,_imgtogb::Tile_&,_true>
                  (&local_98,(int *)&range.second,(Tile *)local_48);
        std::
        multimap<int,imgtogb::Tile,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
        ::insert<std::pair<int,imgtogb::Tile>>
                  ((multimap<int,imgtogb::Tile,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
                    *)&this->map,&local_98);
        sVar1 = this->ntiles;
        this->ntiles = sVar1 + 1;
        piVar5 = boost::numeric::ublas::
                 matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
                 ::operator()(&this->tilemap,tile._16_8_,ix);
        *piVar5 = (int)sVar1;
      }
    }
    ix = ix + 1;
  } while( true );
}

Assistant:

Tilemap::Tilemap(
		const Image &img,
		int offset
	)
	: img(&img)
	, offset(offset)
	, tiles_x(img.width() / 8)
	, tiles_y(img.height() / 8)
	, ntiles(0)
	, tilemap(tiles_x, tiles_y)
	{
		for(size_t iy = 0; iy < tiles_y; ++iy) {
			for(size_t ix = 0; ix < tiles_x; ++ix) {
				Tile tile(ix, iy, ntiles);
				int hash = tile_hash(tile, img);

				// Look for existing tiles with same hash
				mmap_range range = map.equal_range(hash);
				bool found = range.first != range.second;

				if(found) {
					found = false;
					for(mmap::iterator it = range.first; it != range.second; ++it) {
						if(compare(tile, it->second, img) == true) {
							found = true;
							tilemap(ix, iy) = it->second.id;
							break;
						}
					}
				}

				// Add new tile if not found
				if(!found) {
					map.insert(std::pair<int,Tile>(hash, tile));
					tilemap(ix, iy) = ntiles++;
				}
			}
		}
	}